

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

int getPoIndex(Aig_Man_t *pAig,Aig_Obj_t *pPivot)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  int i;
  Aig_Obj_t *pPivot_local;
  Aig_Man_t *pAig_local;
  
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Saig_ManPoNum(pAig);
    if (iVar1 <= pObj._4_4_) {
      return -1;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pObj._4_4_);
    if (pAVar2 == pPivot) break;
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  return pObj._4_4_;
}

Assistant:

int getPoIndex( Aig_Man_t *pAig, Aig_Obj_t *pPivot )
{
	int i;
	Aig_Obj_t *pObj;

	Saig_ManForEachPo( pAig, pObj, i )
	{
		if( pObj == pPivot )
			return i;
	}
	return -1;
}